

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

size_type __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::size(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
       *this)

{
  array_t *paVar1;
  uint uVar2;
  size_type sVar3;
  
  uVar2 = (this->m_type).data & 0xf;
  sVar3 = (size_type)uVar2;
  if (((this->m_type).data & 0xf) != 0) {
    if (uVar2 == 1) {
      if ((this->m_value).object == (object_t *)0x0) {
        __assert_fail("m_value.object != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                      ,0x11e9,
                      "size_type nlohmann::basic_json<>::size() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                     );
      }
      sVar3 = (((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (uVar2 == 2) {
      paVar1 = (this->m_value).array;
      if (paVar1 == (array_t *)0x0) {
        __assert_fail("m_value.array != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                      ,0x11e3,
                      "size_type nlohmann::basic_json<>::size() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                     );
      }
      sVar3 = (long)(paVar1->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(paVar1->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4;
    }
    else {
      sVar3 = 1;
    }
  }
  return sVar3;
}

Assistant:

size_type size() const noexcept
        {
            switch (m_type)
            {
                case value_t::null:
                {
                    // null values are empty
                    return 0;
                }

                case value_t::array:
                {
                    assert(m_value.array != nullptr);
                    return m_value.array->size();
                }

                case value_t::object:
                {
                    assert(m_value.object != nullptr);
                    return m_value.object->size();
                }

                default:
                {
                    // all other types have size 1
                    return 1;
                }
            }
        }